

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicornafl.cpp
# Opt level: O0

void __thiscall UCAFL::_may_use_shm_testcase(UCAFL *this)

{
  int __shmid;
  char *__nptr;
  uint32_t *puVar1;
  double __x;
  uint32_t *map;
  int shm_id;
  char *id_str;
  UCAFL *this_local;
  
  __nptr = getenv("__AFL_SHM_FUZZ_ID");
  if (__nptr == (char *)0x0) {
    this->afl_use_shm_testcase_ = false;
    log(__x);
  }
  else {
    __shmid = atoi(__nptr);
    puVar1 = (uint32_t *)shmat(__shmid,(void *)0x0,0);
    if ((puVar1 == (uint32_t *)0x0) || (puVar1 == (uint32_t *)0xffffffffffffffff)) {
      perror("[!] could not access fuzzing shared memory");
      exit(1);
    }
    this->afl_testcase_len_p_ = puVar1;
    this->afl_testcase_ptr_ = puVar1 + 1;
    this->afl_use_shm_testcase_ = true;
  }
  return;
}

Assistant:

void _may_use_shm_testcase() {
        char* id_str = getenv(SHM_FUZZ_ENV_VAR);

        if (id_str) {
            int shm_id = atoi(id_str);
            uint32_t* map = (uint32_t*)shmat(shm_id, NULL, 0);
            if (!map || map == MAP_FAILED) {
                perror("[!] could not access fuzzing shared memory");
                exit(1);
            }

            this->afl_testcase_len_p_ = map;
            this->afl_testcase_ptr_ = map + 1;
            this->afl_use_shm_testcase_ = true;
            return;
        } else {
            this->afl_use_shm_testcase_ = false;
            ERR("SHARED MEMORY FUZZING Feature is not enabled.\n");
            return;
        }
    }